

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O1

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::UniformToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts)

{
  pointer *ppuVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  size_t num_uniforms;
  undefined1 local_c8 [24];
  undefined8 uStack_b0;
  string local_a8;
  void *local_88;
  pointer puStack_80;
  pointer local_78;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  unsigned_long local_38;
  
  local_88 = (void *)0x0;
  puStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  local_68._8_8_ = src;
  if (src == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    local_c8._0_8_ = "stride_bytes is zero.";
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)local_c8);
    goto LAB_0033ff93;
  }
  local_68._0_8_ = (ulong)(*(long *)(this + 8) - *(long *)this) / (ulong)src;
  if ((ulong)(*(long *)(this + 8) - *(long *)this) % (ulong)src == 0) {
    if ((pointer)local_68._0_8_ !=
        (pointer)(*(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2)) {
      local_58._M_allocated_capacity = (size_type)&local_48;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_68 + 0x10),
                 "The number of input uniform attributes {} must be the same with faceVertexCounts.size() {}"
                 ,"");
      local_38 = *(long *)(stride_bytes + 8) - *(long *)stride_bytes >> 2;
      fmt::format<unsigned_long,unsigned_long>
                (&local_a8,(fmt *)(local_68 + 0x10),(string *)local_68,&local_38,
                 (unsigned_long *)faceVertexCounts);
      goto LAB_0033fee5;
    }
    local_c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._16_8_ = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,(size_type)src);
    lVar4 = *(long *)stride_bytes;
    if (*(long *)(stride_bytes + 8) != lVar4) {
      uVar7 = 0;
      do {
        uVar3 = *(uint *)(lVar4 + uVar7 * 4);
        memcpy((void *)local_c8._0_8_,(void *)(local_68._8_8_ * uVar7 + *(long *)this),
               local_68._8_8_);
        for (uVar6 = (ulong)uVar3; uVar6 != 0; uVar6 = uVar6 - 1) {
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,puStack_80,
                     local_c8._0_8_,local_c8._8_8_);
        }
        uVar7 = uVar7 + 1;
        lVar4 = *(long *)stride_bytes;
      } while (uVar7 < (ulong)(*(long *)(stride_bytes + 8) - lVar4 >> 2));
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = true;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_80;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_78;
    local_88 = (void *)0x0;
    puStack_80 = (pointer)0x0;
    local_78 = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0033ff93;
    uVar7 = local_c8._16_8_ - local_c8._0_8_;
    uVar8 = local_c8._0_8_;
  }
  else {
    local_58._M_allocated_capacity = (size_type)&local_48;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_68 + 0x10),"input bytes {} must be the multiple of stride_bytes {}",
               "");
    local_68._0_8_ = *(long *)(this + 8) - *(long *)this;
    fmt::format<unsigned_long,unsigned_long>
              (&local_a8,(fmt *)(local_68 + 0x10),(string *)local_68,(unsigned_long *)(local_68 + 8)
               ,(unsigned_long *)faceVertexCounts);
LAB_0033fee5:
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_c8 + 0x10);
    paVar2 = &local_a8.field_2;
    local_c8._0_8_ = local_a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == paVar2) {
      uStack_b0 = local_a8.field_2._8_8_;
      local_c8._0_8_ = paVar5;
    }
    local_c8._17_7_ = local_a8.field_2._M_allocated_capacity._1_7_;
    local_c8[0x10] = local_a8.field_2._M_local_buf[0];
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    ppuVar1 = &(__return_storage_ptr__->contained).
               super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ == paVar5) {
      *ppuVar1 = (pointer)local_c8._16_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = uStack_b0;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_c8._0_8_;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_a8._M_string_length;
    local_c8._16_8_ = (ulong)(uint7)local_a8.field_2._M_allocated_capacity._1_7_ << 8;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_string_length = 0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._0_8_ = paVar5;
    local_a8._M_dataplus._M_p = (pointer)paVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_allocated_capacity == &local_48) goto LAB_0033ff93;
    uVar7 = local_48._M_allocated_capacity + 1;
    uVar8 = local_58._M_allocated_capacity;
  }
  operator_delete((void *)uVar8,uVar7);
LAB_0033ff93:
  if (local_88 != (void *)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> UniformToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts) {
  std::vector<uint8_t> dst;

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes is zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("input bytes {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  size_t num_uniforms = src.size() / stride_bytes;

  if (num_uniforms != faceVertexCounts.size()) {
    return nonstd::make_unexpected(fmt::format(
        "The number of input uniform attributes {} must be the same with "
        "faceVertexCounts.size() {}",
        num_uniforms, faceVertexCounts.size()));
  }

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    memcpy(buf.data(), src.data() + i * stride_bytes, stride_bytes);

    // repeat cnt times.
    for (size_t k = 0; k < cnt; k++) {
      dst.insert(dst.end(), buf.begin(), buf.end());
    }
  }

  return dst;
}